

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.cpp
# Opt level: O2

MessageProcessingResult __thiscall
helics::GlobalTimeCoordinator::checkExecEntry(GlobalTimeCoordinator *this,GlobalFederateId param_1)

{
  bool bVar1;
  DependencyInfo *dep;
  pointer pDVar2;
  MessageProcessingResult MVar3;
  string_view str;
  ActionMessage execgrant;
  
  if ((this->super_BaseTimeCoordinator).checkingExec == false) {
    MVar3 = CONTINUE_PROCESSING;
    if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      ActionMessage::ActionMessage(&execgrant,cmd_log);
      execgrant.messageID = 3;
      execgrant.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      str._M_str = "calling checkExecEntry without first calling enterExec this is probably a bug";
      str._M_len = 0x4d;
      execgrant.dest_id.gid = execgrant.source_id.gid;
      ActionMessage::setString(&execgrant,0,str);
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                (&(this->super_BaseTimeCoordinator).sendMessageFunction,&execgrant);
      ActionMessage::~ActionMessage(&execgrant);
    }
  }
  else {
    bVar1 = TimeDependencies::checkIfReadyForExecEntry
                      (&(this->super_BaseTimeCoordinator).dependencies,false,false);
    if (!bVar1) {
      if (this->currentTimeState != exec_requested_iterative) {
        return CONTINUE_PROCESSING;
      }
      for (pDVar2 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pDVar2 != (this->super_BaseTimeCoordinator).dependencies.dependencies.
                    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pDVar2 = pDVar2 + 1) {
        if (pDVar2->dependency == true) {
          if ((pDVar2->super_TimeData).minFed.gid != (this->super_BaseTimeCoordinator).mSourceId.gid
             ) {
            return CONTINUE_PROCESSING;
          }
          if ((pDVar2->super_TimeData).responseSequenceCounter !=
              (this->super_BaseTimeCoordinator).sequenceCounter) {
            return CONTINUE_PROCESSING;
          }
        }
      }
    }
    (this->super_BaseTimeCoordinator).executionMode = true;
    (this->currentMinTime).internalTimeCode = 0;
    this->currentTimeState = time_granted;
    (this->nextEvent).internalTimeCode = 0;
    ActionMessage::ActionMessage(&execgrant,cmd_exec_grant);
    execgrant.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
    transmitTimingMessagesDownstream(this,&execgrant,(GlobalFederateId)0x8831d580);
    transmitTimingMessagesUpstream(this,&execgrant);
    ActionMessage::~ActionMessage(&execgrant);
    MVar3 = NEXT_STEP;
  }
  return MVar3;
}

Assistant:

MessageProcessingResult GlobalTimeCoordinator::checkExecEntry(GlobalFederateId /*triggerFed*/)
{
    if (!checkingExec) {
        if (sendMessageFunction) {
            ActionMessage logcmd(CMD_LOG);
            logcmd.messageID = HELICS_LOG_LEVEL_WARNING;
            logcmd.dest_id = mSourceId;
            logcmd.source_id = mSourceId;
            logcmd.setString(
                0, "calling checkExecEntry without first calling enterExec this is probably a bug");
            sendMessageFunction(logcmd);
        }
        return MessageProcessingResult::CONTINUE_PROCESSING;
    }
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;
    if (!dependencies.checkIfReadyForExecEntry(false, false)) {
        bool allowed{false};
        if (currentTimeState == TimeState::exec_requested_iterative) {
            allowed = true;
            for (const auto& dep : dependencies) {
                if (dep.dependency) {
                    if (dep.minFed != mSourceId) {
                        allowed = false;
                        break;
                    }
                    if (dep.responseSequenceCounter != sequenceCounter) {
                        allowed = false;
                        break;
                    }
                }
            }
        }
        if (!allowed) {
            return ret;
        }
    }
    executionMode = true;
    ret = MessageProcessingResult::NEXT_STEP;

    currentMinTime = timeZero;
    currentTimeState = TimeState::time_granted;
    nextEvent = timeZero;

    ActionMessage execgrant(CMD_EXEC_GRANT);
    execgrant.source_id = mSourceId;
    transmitTimingMessagesDownstream(execgrant);
    transmitTimingMessagesUpstream(execgrant);
    return ret;
}